

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O0

void obj::remove_eol(char *ptr)

{
  int iVar1;
  bool bVar2;
  int local_14;
  int i;
  char *ptr_local;
  
  for (local_14 = 0; ptr[local_14] != '\0'; local_14 = local_14 + 1) {
  }
  while( true ) {
    local_14 = local_14 + -1;
    bVar2 = false;
    if (0 < local_14) {
      iVar1 = isspace((int)ptr[local_14]);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    ptr[local_14] = '\0';
  }
  return;
}

Assistant:

inline void remove_eol(char* ptr) {
    int i = 0;
    while (ptr[i]) i++;
    i--;
    while (i > 0 && std::isspace(ptr[i])) {
        ptr[i] = '\0';
        i--;
    }
}